

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s128_30_256_idx(mzd_local_t *c,mzd_local_t *A,word idx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  ulong *puVar8;
  long lVar9;
  word in_RDX;
  long in_RSI;
  ulong *in_RDI;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint i;
  word128 cval [4];
  block_t *Ablock;
  block_t *cblock;
  uint i_2;
  uint i_1;
  int local_22c;
  ulong local_228 [4];
  ulong local_208 [5];
  long local_1e0;
  ulong *local_1d8;
  word local_1d0;
  ulong *local_178;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  uint local_100;
  undefined4 local_fc;
  ulong local_f8;
  ulong uStack_f0;
  long local_e0;
  ulong *local_d8;
  undefined1 (*local_d0) [16];
  undefined1 local_c8 [16];
  ulong local_b8;
  ulong uStack_b0;
  uint local_a0;
  undefined4 local_9c;
  ulong local_98;
  ulong uStack_90;
  long local_80;
  ulong *local_78;
  undefined1 (*local_70) [16];
  undefined1 local_68 [16];
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_228[0] = *in_RDI;
  local_228[1] = in_RDI[1];
  local_178 = in_RDI + 2;
  local_228[2] = *local_178;
  local_228[3] = in_RDI[3];
  local_118 = (undefined1  [16])0x0;
  local_208[0] = 0;
  local_208[1] = 0;
  local_128 = (undefined1  [16])0x0;
  local_128._0_8_ = 0;
  local_128._8_8_ = 0;
  local_208[2] = 0;
  local_208[3] = 0;
  uVar10 = local_128._0_8_;
  uVar12 = local_128._8_8_;
  local_1e0 = in_RSI;
  local_1d8 = in_RDI;
  local_1d0 = in_RDX;
  for (local_22c = 0x1e; lVar9 = local_1e0, local_22c != 0; local_22c = local_22c + -2) {
    mm128_compute_mask(local_1d0,0);
    local_80 = lVar9;
    local_9c = 2;
    uVar11 = uVar10;
    uVar13 = uVar12;
    for (local_a0 = 0; local_a0 != 2; local_a0 = local_a0 + 1) {
      uVar2 = local_228[(ulong)local_a0 * 2];
      uVar3 = local_228[(ulong)local_a0 * 2 + 1];
      pauVar7 = (undefined1 (*) [16])(lVar9 + (ulong)local_a0 * 0x10);
      uVar4 = *(undefined8 *)*pauVar7;
      uVar5 = *(undefined8 *)(*pauVar7 + 8);
      auVar6._8_8_ = uVar12;
      auVar6._0_8_ = uVar10;
      auVar1 = vpand_avx(*pauVar7,auVar6);
      local_68._0_8_ = auVar1._0_8_;
      local_68._8_8_ = auVar1._8_8_;
      uVar11 = uVar2 ^ local_68._0_8_;
      uVar13 = uVar3 ^ local_68._8_8_;
      local_228[(ulong)local_a0 * 2] = uVar11;
      local_228[(ulong)local_a0 * 2 + 1] = uVar13;
      local_70 = pauVar7;
      local_68 = auVar1;
      local_58 = uVar2;
      uStack_50 = uVar3;
      local_48 = uVar10;
      uStack_40 = uVar12;
      local_38 = uVar4;
      uStack_30 = uVar5;
    }
    puVar8 = local_228 + 4;
    lVar9 = local_1e0 + 0x20;
    local_98 = uVar10;
    uStack_90 = uVar12;
    local_78 = local_228;
    mm128_compute_mask(local_1d0,1);
    local_fc = 2;
    uVar10 = uVar11;
    uVar12 = uVar13;
    for (local_100 = 0; local_100 != 2; local_100 = local_100 + 1) {
      uVar2 = puVar8[(ulong)local_100 * 2];
      uVar3 = local_228[(ulong)local_100 * 2 + 5];
      pauVar7 = (undefined1 (*) [16])(lVar9 + (ulong)local_100 * 0x10);
      uVar4 = *(undefined8 *)*pauVar7;
      uVar5 = *(undefined8 *)(*pauVar7 + 8);
      auVar1._8_8_ = uVar13;
      auVar1._0_8_ = uVar11;
      auVar1 = vpand_avx(*pauVar7,auVar1);
      local_c8._0_8_ = auVar1._0_8_;
      local_c8._8_8_ = auVar1._8_8_;
      uVar10 = uVar2 ^ local_c8._0_8_;
      uVar12 = uVar3 ^ local_c8._8_8_;
      puVar8[(ulong)local_100 * 2] = uVar10;
      local_228[(ulong)local_100 * 2 + 5] = uVar12;
      local_d0 = pauVar7;
      local_c8 = auVar1;
      local_b8 = uVar2;
      uStack_b0 = uVar3;
      local_28 = uVar11;
      uStack_20 = uVar13;
      local_18 = uVar4;
      uStack_10 = uVar5;
    }
    local_1d0 = local_1d0 >> 2;
    local_1e0 = local_1e0 + 0x40;
    local_f8 = uVar11;
    uStack_f0 = uVar13;
    local_e0 = lVar9;
    local_d8 = puVar8;
  }
  *local_1d8 = local_228[0] ^ local_208[0];
  local_1d8[1] = local_228[1] ^ local_208[1];
  local_1d8[2] = local_228[2] ^ local_208[2];
  local_1d8[3] = local_228[3] ^ local_208[3];
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mzd_addmul_v_s128_30_256_idx(mzd_local_t* c, mzd_local_t const* A, word idx) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(&cblock->w64[0]), mm128_load(&cblock->w64[2]), mm128_zero,
                     mm128_zero};
  for (unsigned int i = 30; i; i -= 2, idx >>= 2, Ablock += 2) {
    mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
    mm128_xor_mask_region(&cval[2], Ablock[1].w64, mm128_compute_mask(idx, 1), 2);
  }
  mm128_store(&cblock->w64[0], mm128_xor(cval[0], cval[2]));
  mm128_store(&cblock->w64[2], mm128_xor(cval[1], cval[3]));
}